

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFileLock(unixFile *pFile,flock *pLock)

{
  undefined2 local_50;
  undefined2 local_4e;
  flock lock;
  unixInodeInfo *pInode;
  int rc;
  flock *pLock_local;
  unixFile *pFile_local;
  
  lock._24_8_ = pFile->pInode;
  if ((pFile->ctrlFlags & 3) == 1) {
    if (((unixInodeInfo *)lock._24_8_)->bProcessLock == '\0') {
      local_4e = 0;
      lock._0_8_ = SEXT48(sqlite3PendingByte + 2);
      lock.l_start = 0x1fe;
      local_50 = 1;
      pInode._4_4_ = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6,&local_50);
      if (pInode._4_4_ < 0) {
        return pInode._4_4_;
      }
      *(undefined1 *)(lock._24_8_ + 0x15) = 1;
      *(int *)(lock._24_8_ + 0x28) = *(int *)(lock._24_8_ + 0x28) + 1;
    }
    else {
      pInode._4_4_ = 0;
    }
  }
  else {
    pInode._4_4_ = (*aSyscall[7].pCurrent)((ulong)(uint)pFile->h,6,pLock);
  }
  return pInode._4_4_;
}

Assistant:

static int unixFileLock(unixFile *pFile, struct flock *pLock){
  int rc;
  unixInodeInfo *pInode = pFile->pInode;
  assert( unixMutexHeld() );
  assert( pInode!=0 );
  if( (pFile->ctrlFlags & (UNIXFILE_EXCL|UNIXFILE_RDONLY))==UNIXFILE_EXCL ){
    if( pInode->bProcessLock==0 ){
      struct flock lock;
      assert( pInode->nLock==0 );
      lock.l_whence = SEEK_SET;
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
      lock.l_type = F_WRLCK;
      rc = osFcntl(pFile->h, F_SETLK, &lock);
      if( rc<0 ) return rc;
      pInode->bProcessLock = 1;
      pInode->nLock++;
    }else{
      rc = 0;
    }
  }else{
    rc = osFcntl(pFile->h, F_SETLK, pLock);
  }
  return rc;
}